

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O1

client * workspace_find_window_client(workspace *workspace,xcb_window_t window)

{
  undefined8 *puVar1;
  client *pcVar2;
  client *pcVar3;
  bool bVar4;
  
  pcVar3 = (client *)workspace->clients;
  puVar1 = *(undefined8 **)pcVar3;
  while( true ) {
    if (puVar1 == (undefined8 *)0x0) {
      return (client *)0x0;
    }
    pcVar2 = (client *)puVar1[2];
    if (pcVar2 == (client *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = pcVar2->window == window;
      if (bVar4) {
        pcVar3 = pcVar2;
      }
    }
    if (bVar4) break;
    puVar1 = (undefined8 *)*puVar1;
  }
  return pcVar3;
}

Assistant:

struct client *workspace_find_window_client(const struct workspace *workspace, xcb_window_t window)
{
        LIST_FOR_EACH(workspace->clients, node)
        {
                struct client *client = get_client_from_client_node(node);

                if (client == NULL) {
                        continue;
                }

                if (client->window == window) {
                        return client;
                }
        }

        return NULL;
}